

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgBuiltinFunctions.hpp
# Opt level: O0

bool rsg::TanOp::transformValueRange(float outMin,float outMax,float *inMin,float *inMax)

{
  float fVar1;
  float rangeMax;
  float rangeMin;
  float *inMax_local;
  float *inMin_local;
  float outMax_local;
  float outMin_local;
  
  if ((outMax < -4.0) || (4.0 < outMin)) {
    outMax_local._3_1_ = false;
  }
  else {
    fVar1 = deFloatMax(outMin,-4.0);
    fVar1 = deFloatAtanOver(fVar1);
    *inMin = fVar1;
    fVar1 = deFloatMin(outMax,4.0);
    fVar1 = deFloatAtanOver(fVar1);
    *inMax = fVar1;
    outMax_local._3_1_ = true;
  }
  return outMax_local._3_1_;
}

Assistant:

static inline bool transformValueRange (float outMin, float outMax, float& inMin, float& inMax)
	{
		// \note Currently tan() is limited to -4..4 range. Otherwise we will run into accuracy issues
		const float rangeMin = -4.0f;
		const float rangeMax = +4.0f;

		if (outMax < rangeMin || outMin > rangeMax)
			return false;

		inMin = deFloatAtanOver(deFloatMax(outMin, rangeMin));
		inMax = deFloatAtanOver(deFloatMin(outMax, rangeMax));

		return true;
	}